

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

void proto2_unittest::TestAllTypesLite::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint32_t uVar1;
  uint32_t uVar2;
  anon_union_824_1_493b367e_for_TestAllTypesLite_10 *paVar3;
  TestAllTypesLite *pTVar4;
  TestAllTypesLite **v1;
  TestAllTypesLite **v2;
  char *failure_msg;
  LogMessage *pLVar5;
  RepeatedField<int> *pRVar6;
  RepeatedField<int> *pRVar7;
  RepeatedField<long> *pRVar8;
  RepeatedField<long> *pRVar9;
  RepeatedField<unsigned_int> *pRVar10;
  RepeatedField<unsigned_int> *pRVar11;
  RepeatedField<unsigned_long> *pRVar12;
  RepeatedField<unsigned_long> *pRVar13;
  RepeatedField<float> *this;
  RepeatedField<float> *other;
  RepeatedField<double> *this_00;
  RepeatedField<double> *other_00;
  RepeatedField<bool> *this_01;
  RepeatedField<bool> *other_01;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar14;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar15;
  RepeatedPtrField<proto2_unittest::TestAllTypesLite_RepeatedGroup> *this_02;
  RepeatedPtrField<proto2_unittest::TestAllTypesLite_RepeatedGroup> *other_02;
  RepeatedPtrField<proto2_unittest::TestAllTypesLite_NestedMessage> *pRVar16;
  RepeatedPtrField<proto2_unittest::TestAllTypesLite_NestedMessage> *pRVar17;
  RepeatedPtrField<proto2_unittest::ForeignMessageLite> *this_03;
  RepeatedPtrField<proto2_unittest::ForeignMessageLite> *other_03;
  RepeatedPtrField<proto2_unittest_import::ImportMessageLite> *this_04;
  RepeatedPtrField<proto2_unittest_import::ImportMessageLite> *other_04;
  uint32_t *puVar18;
  Arena *pAVar19;
  TestAllTypesLite_OptionalGroup *pTVar20;
  TestAllTypesLite_NestedMessage *pTVar21;
  ForeignMessageLite *pFVar22;
  ImportMessageLite *pIVar23;
  PublicImportMessageLite *pPVar24;
  Cord *value;
  string *psVar25;
  MessageLite *pMVar26;
  bool bVar27;
  bool oneof_needs_init;
  uint32_t oneof_to_case;
  uint32_t oneof_from_case;
  Voidify local_22a;
  byte local_229;
  LogMessage local_228;
  Voidify local_212;
  byte local_211;
  LogMessage local_210;
  Voidify local_1fa;
  byte local_1f9;
  LogMessage local_1f8;
  Voidify local_1e2;
  byte local_1e1;
  LogMessage local_1e0;
  Voidify local_1ca;
  byte local_1c9;
  LogMessage local_1c8;
  Voidify local_1b2;
  byte local_1b1;
  LogMessage local_1b0;
  Voidify local_199;
  uint local_198;
  uint32_t cached_has_bits;
  LogMessage local_188;
  Voidify local_171;
  TestAllTypesLite *local_170;
  Nullable<const_char_*> local_168;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Arena *arena;
  TestAllTypesLite *from;
  TestAllTypesLite *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  Nullable<const_char_*> local_130;
  CleanupNode *local_128;
  Nullable<const_char_*> local_120;
  Chunk *local_118;
  Nullable<const_char_*> local_110;
  void *local_108;
  Nullable<const_char_*> local_100;
  __pointer_type local_f8;
  Nullable<const_char_*> local_f0;
  char *local_e8;
  Nullable<const_char_*> local_e0;
  char *local_d8;
  Nullable<const_char_*> local_d0;
  string *local_c8;
  TestAllTypesLite *local_c0;
  anon_union_824_1_493b367e_for_TestAllTypesLite_10 *local_b8;
  string *local_b0;
  TestAllTypesLite *local_a8;
  anon_union_824_1_493b367e_for_TestAllTypesLite_10 *local_a0;
  string *local_98;
  TestAllTypesLite *local_90;
  anon_union_824_1_493b367e_for_TestAllTypesLite_10 *local_88;
  string *local_80;
  TestAllTypesLite *local_78;
  anon_union_824_1_493b367e_for_TestAllTypesLite_10 *local_70;
  string *local_68;
  TestAllTypesLite *local_60;
  anon_union_824_1_493b367e_for_TestAllTypesLite_10 *local_58;
  string *local_50;
  TestAllTypesLite *local_48;
  anon_union_824_1_493b367e_for_TestAllTypesLite_10 *local_40;
  string *local_38;
  TestAllTypesLite *local_30;
  anon_union_824_1_493b367e_for_TestAllTypesLite_10 *local_28;
  string *local_20;
  TestAllTypesLite *local_18;
  anon_union_824_1_493b367e_for_TestAllTypesLite_10 *local_10;
  
  arena = (Arena *)from_msg;
  from = (TestAllTypesLite *)to_msg;
  _this = (TestAllTypesLite *)from_msg;
  from_msg_local = to_msg;
  absl_log_internal_check_op_result =
       (Nullable<const_char_*>)google::protobuf::MessageLite::GetArena(to_msg);
  local_170 = (TestAllTypesLite *)arena;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto2_unittest::TestAllTypesLite_const*>(&local_170);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<proto2_unittest::TestAllTypesLite*>
                 (&from);
  local_168 = absl::lts_20250127::log_internal::
              Check_NEImpl<proto2_unittest::TestAllTypesLite_const*,proto2_unittest::TestAllTypesLite*>
                        (v1,v2,"&from != _this");
  if (local_168 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_168);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_188,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_lite.pb.cc"
               ,0x10b4,failure_msg);
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_188);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_171,pLVar5);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_188);
  }
  local_198 = 0;
  pRVar6 = _internal_mutable_repeated_int32(from);
  pRVar7 = _internal_repeated_int32((TestAllTypesLite *)arena);
  google::protobuf::RepeatedField<int>::MergeFrom(pRVar6,pRVar7);
  pRVar8 = _internal_mutable_repeated_int64(from);
  pRVar9 = _internal_repeated_int64((TestAllTypesLite *)arena);
  google::protobuf::RepeatedField<long>::MergeFrom(pRVar8,pRVar9);
  pRVar10 = _internal_mutable_repeated_uint32(from);
  pRVar11 = _internal_repeated_uint32((TestAllTypesLite *)arena);
  google::protobuf::RepeatedField<unsigned_int>::MergeFrom(pRVar10,pRVar11);
  pRVar12 = _internal_mutable_repeated_uint64(from);
  pRVar13 = _internal_repeated_uint64((TestAllTypesLite *)arena);
  google::protobuf::RepeatedField<unsigned_long>::MergeFrom(pRVar12,pRVar13);
  pRVar6 = _internal_mutable_repeated_sint32(from);
  pRVar7 = _internal_repeated_sint32((TestAllTypesLite *)arena);
  google::protobuf::RepeatedField<int>::MergeFrom(pRVar6,pRVar7);
  pRVar8 = _internal_mutable_repeated_sint64(from);
  pRVar9 = _internal_repeated_sint64((TestAllTypesLite *)arena);
  google::protobuf::RepeatedField<long>::MergeFrom(pRVar8,pRVar9);
  pRVar10 = _internal_mutable_repeated_fixed32(from);
  pRVar11 = _internal_repeated_fixed32((TestAllTypesLite *)arena);
  google::protobuf::RepeatedField<unsigned_int>::MergeFrom(pRVar10,pRVar11);
  pRVar12 = _internal_mutable_repeated_fixed64(from);
  pRVar13 = _internal_repeated_fixed64((TestAllTypesLite *)arena);
  google::protobuf::RepeatedField<unsigned_long>::MergeFrom(pRVar12,pRVar13);
  pRVar6 = _internal_mutable_repeated_sfixed32(from);
  pRVar7 = _internal_repeated_sfixed32((TestAllTypesLite *)arena);
  google::protobuf::RepeatedField<int>::MergeFrom(pRVar6,pRVar7);
  pRVar8 = _internal_mutable_repeated_sfixed64(from);
  pRVar9 = _internal_repeated_sfixed64((TestAllTypesLite *)arena);
  google::protobuf::RepeatedField<long>::MergeFrom(pRVar8,pRVar9);
  this = _internal_mutable_repeated_float(from);
  other = _internal_repeated_float((TestAllTypesLite *)arena);
  google::protobuf::RepeatedField<float>::MergeFrom(this,other);
  this_00 = _internal_mutable_repeated_double(from);
  other_00 = _internal_repeated_double((TestAllTypesLite *)arena);
  google::protobuf::RepeatedField<double>::MergeFrom(this_00,other_00);
  this_01 = _internal_mutable_repeated_bool(from);
  other_01 = _internal_repeated_bool((TestAllTypesLite *)arena);
  google::protobuf::RepeatedField<bool>::MergeFrom(this_01,other_01);
  pRVar14 = _internal_mutable_repeated_string_abi_cxx11_(from);
  pRVar15 = _internal_repeated_string_abi_cxx11_((TestAllTypesLite *)arena);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(pRVar14,pRVar15);
  pRVar14 = _internal_mutable_repeated_bytes_abi_cxx11_(from);
  pRVar15 = _internal_repeated_bytes_abi_cxx11_((TestAllTypesLite *)arena);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(pRVar14,pRVar15);
  this_02 = _internal_mutable_repeatedgroup(from);
  other_02 = _internal_repeatedgroup((TestAllTypesLite *)arena);
  google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite_RepeatedGroup>::MergeFrom
            (this_02,other_02);
  pRVar16 = _internal_mutable_repeated_nested_message(from);
  pRVar17 = _internal_repeated_nested_message((TestAllTypesLite *)arena);
  google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite_NestedMessage>::MergeFrom
            (pRVar16,pRVar17);
  this_03 = _internal_mutable_repeated_foreign_message(from);
  other_03 = _internal_repeated_foreign_message((TestAllTypesLite *)arena);
  google::protobuf::RepeatedPtrField<proto2_unittest::ForeignMessageLite>::MergeFrom
            (this_03,other_03);
  this_04 = _internal_mutable_repeated_import_message(from);
  other_04 = _internal_repeated_import_message((TestAllTypesLite *)arena);
  google::protobuf::RepeatedPtrField<proto2_unittest_import::ImportMessageLite>::MergeFrom
            (this_04,other_04);
  pRVar6 = _internal_mutable_repeated_nested_enum(from);
  pRVar7 = _internal_repeated_nested_enum((TestAllTypesLite *)arena);
  google::protobuf::RepeatedField<int>::MergeFrom(pRVar6,pRVar7);
  pRVar6 = _internal_mutable_repeated_foreign_enum(from);
  pRVar7 = _internal_repeated_foreign_enum((TestAllTypesLite *)arena);
  google::protobuf::RepeatedField<int>::MergeFrom(pRVar6,pRVar7);
  pRVar6 = _internal_mutable_repeated_import_enum(from);
  pRVar7 = _internal_repeated_import_enum((TestAllTypesLite *)arena);
  google::protobuf::RepeatedField<int>::MergeFrom(pRVar6,pRVar7);
  pRVar14 = _internal_mutable_repeated_string_piece_abi_cxx11_(from);
  pRVar15 = _internal_repeated_string_piece_abi_cxx11_((TestAllTypesLite *)arena);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(pRVar14,pRVar15);
  pRVar14 = _internal_mutable_repeated_cord_abi_cxx11_(from);
  pRVar15 = _internal_repeated_cord_abi_cxx11_((TestAllTypesLite *)arena);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(pRVar14,pRVar15);
  pRVar16 = _internal_mutable_repeated_lazy_message(from);
  pRVar17 = _internal_repeated_lazy_message((TestAllTypesLite *)arena);
  google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite_NestedMessage>::MergeFrom
            (pRVar16,pRVar17);
  puVar18 = google::protobuf::internal::HasBits<2>::operator[]
                      ((HasBits<2> *)&(arena->impl_).field_0x10,0);
  pTVar4 = from;
  local_198 = *puVar18;
  if ((local_198 & 0xff) != 0) {
    if ((local_198 & 1) != 0) {
      local_c8 = _internal_optional_string_abi_cxx11_((TestAllTypesLite *)arena);
      local_c0 = pTVar4;
      local_b8 = &pTVar4->field_0;
      puVar18 = google::protobuf::internal::HasBits<2>::operator[]
                          (&(pTVar4->field_0)._impl_._has_bits_,0);
      psVar25 = local_c8;
      *puVar18 = *puVar18 | 1;
      pAVar19 = google::protobuf::MessageLite::GetArena(&pTVar4->super_MessageLite);
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(pTVar4->field_0)._impl_.optional_string_,psVar25,pAVar19);
    }
    pTVar4 = from;
    if ((local_198 & 2) != 0) {
      local_b0 = _internal_optional_bytes_abi_cxx11_((TestAllTypesLite *)arena);
      local_a8 = pTVar4;
      local_a0 = &pTVar4->field_0;
      puVar18 = google::protobuf::internal::HasBits<2>::operator[]
                          (&(pTVar4->field_0)._impl_._has_bits_,0);
      psVar25 = local_b0;
      *puVar18 = *puVar18 | 2;
      pAVar19 = google::protobuf::MessageLite::GetArena(&pTVar4->super_MessageLite);
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(pTVar4->field_0)._impl_.optional_bytes_,psVar25,pAVar19);
    }
    pTVar4 = from;
    if ((local_198 & 4) != 0) {
      local_98 = _internal_optional_string_piece_abi_cxx11_((TestAllTypesLite *)arena);
      local_90 = pTVar4;
      local_88 = &pTVar4->field_0;
      puVar18 = google::protobuf::internal::HasBits<2>::operator[]
                          (&(pTVar4->field_0)._impl_._has_bits_,0);
      psVar25 = local_98;
      *puVar18 = *puVar18 | 4;
      pAVar19 = google::protobuf::MessageLite::GetArena(&pTVar4->super_MessageLite);
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(pTVar4->field_0)._impl_.optional_string_piece_,psVar25,pAVar19);
    }
    pTVar4 = from;
    if ((local_198 & 8) != 0) {
      local_80 = _internal_optional_cord_abi_cxx11_((TestAllTypesLite *)arena);
      local_78 = pTVar4;
      local_70 = &pTVar4->field_0;
      puVar18 = google::protobuf::internal::HasBits<2>::operator[]
                          (&(pTVar4->field_0)._impl_._has_bits_,0);
      psVar25 = local_80;
      *puVar18 = *puVar18 | 8;
      pAVar19 = google::protobuf::MessageLite::GetArena(&pTVar4->super_MessageLite);
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(pTVar4->field_0)._impl_.optional_cord_,psVar25,pAVar19);
    }
    if ((local_198 & 0x10) != 0) {
      local_1b1 = 0;
      if (arena[3].impl_.head_._M_b._M_p == (__pointer_type)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_lite.pb.cc"
                   ,0x10e5,"from._impl_.optionalgroup_ != nullptr");
        local_1b1 = 1;
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_1b0);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_199,pLVar5);
      }
      if ((local_1b1 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_1b0);
      }
      if ((from->field_0)._impl_.optionalgroup_ == (TestAllTypesLite_OptionalGroup *)0x0) {
        to_msg_local = (MessageLite *)arena[3].impl_.head_._M_b._M_p;
        local_130 = absl_log_internal_check_op_result;
        pTVar20 = (TestAllTypesLite_OptionalGroup *)
                  google::protobuf::Arena::
                  CopyConstruct<proto2_unittest::TestAllTypesLite_OptionalGroup>
                            ((Arena *)absl_log_internal_check_op_result,to_msg_local);
        (from->field_0)._impl_.optionalgroup_ = pTVar20;
      }
      else {
        TestAllTypesLite_OptionalGroup::MergeFrom
                  ((from->field_0)._impl_.optionalgroup_,
                   (TestAllTypesLite_OptionalGroup *)arena[3].impl_.head_._M_b._M_p);
      }
    }
    if ((local_198 & 0x20) != 0) {
      local_1c9 = 0;
      if (arena[3].impl_.first_owner_ == (void *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_1c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_lite.pb.cc"
                   ,0x10ed,"from._impl_.optional_nested_message_ != nullptr");
        local_1c9 = 1;
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_1c8);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_1b2,pLVar5);
      }
      if ((local_1c9 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_1c8);
      }
      if ((from->field_0)._impl_.optional_nested_message_ == (TestAllTypesLite_NestedMessage *)0x0)
      {
        local_108 = arena[3].impl_.first_owner_;
        local_100 = absl_log_internal_check_op_result;
        pTVar21 = (TestAllTypesLite_NestedMessage *)
                  google::protobuf::Arena::
                  CopyConstruct<proto2_unittest::TestAllTypesLite_NestedMessage>
                            ((Arena *)absl_log_internal_check_op_result,local_108);
        (from->field_0)._impl_.optional_nested_message_ = pTVar21;
      }
      else {
        TestAllTypesLite_NestedMessage::MergeFrom
                  ((from->field_0)._impl_.optional_nested_message_,
                   (TestAllTypesLite_NestedMessage *)arena[3].impl_.first_owner_);
      }
    }
    if ((local_198 & 0x40) != 0) {
      local_1e1 = 0;
      if (arena[3].impl_.first_arena_.ptr_._M_b._M_p == (__pointer_type)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_1e0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_lite.pb.cc"
                   ,0x10f5,"from._impl_.optional_foreign_message_ != nullptr");
        local_1e1 = 1;
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_1e0);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_1ca,pLVar5);
      }
      if ((local_1e1 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_1e0);
      }
      if ((from->field_0)._impl_.optional_foreign_message_ == (ForeignMessageLite *)0x0) {
        local_f8 = arena[3].impl_.first_arena_.ptr_._M_b._M_p;
        local_f0 = absl_log_internal_check_op_result;
        pFVar22 = (ForeignMessageLite *)
                  google::protobuf::Arena::CopyConstruct<proto2_unittest::ForeignMessageLite>
                            ((Arena *)absl_log_internal_check_op_result,local_f8);
        (from->field_0)._impl_.optional_foreign_message_ = pFVar22;
      }
      else {
        ForeignMessageLite::MergeFrom
                  ((from->field_0)._impl_.optional_foreign_message_,
                   (ForeignMessageLite *)arena[3].impl_.first_arena_.ptr_._M_b._M_p);
      }
    }
    if ((local_198 & 0x80) != 0) {
      local_1f9 = 0;
      if (arena[3].impl_.first_arena_.limit_ == (char *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_1f8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_lite.pb.cc"
                   ,0x10fd,"from._impl_.optional_import_message_ != nullptr");
        local_1f9 = 1;
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_1f8);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_1e2,pLVar5);
      }
      if ((local_1f9 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_1f8);
      }
      if ((from->field_0)._impl_.optional_import_message_ == (ImportMessageLite *)0x0) {
        local_e8 = arena[3].impl_.first_arena_.limit_;
        local_e0 = absl_log_internal_check_op_result;
        pIVar23 = (ImportMessageLite *)
                  google::protobuf::Arena::CopyConstruct<proto2_unittest_import::ImportMessageLite>
                            ((Arena *)absl_log_internal_check_op_result,local_e8);
        (from->field_0)._impl_.optional_import_message_ = pIVar23;
      }
      else {
        proto2_unittest_import::ImportMessageLite::MergeFrom
                  ((from->field_0)._impl_.optional_import_message_,
                   (ImportMessageLite *)arena[3].impl_.first_arena_.limit_);
      }
    }
  }
  if ((local_198 & 0xff00) != 0) {
    if ((local_198 & 0x100) != 0) {
      local_211 = 0;
      if (arena[3].impl_.first_arena_.prefetch_ptr_ == (char *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_210,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_lite.pb.cc"
                   ,0x1107,"from._impl_.optional_public_import_message_ != nullptr");
        local_211 = 1;
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_210);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_1fa,pLVar5);
      }
      if ((local_211 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_210);
      }
      if ((from->field_0)._impl_.optional_public_import_message_ == (PublicImportMessageLite *)0x0)
      {
        local_d8 = arena[3].impl_.first_arena_.prefetch_ptr_;
        local_d0 = absl_log_internal_check_op_result;
        pPVar24 = (PublicImportMessageLite *)
                  google::protobuf::Arena::
                  CopyConstruct<proto2_unittest_import::PublicImportMessageLite>
                            ((Arena *)absl_log_internal_check_op_result,local_d8);
        (from->field_0)._impl_.optional_public_import_message_ = pPVar24;
      }
      else {
        proto2_unittest_import::PublicImportMessageLite::MergeFrom
                  ((from->field_0)._impl_.optional_public_import_message_,
                   (PublicImportMessageLite *)arena[3].impl_.first_arena_.prefetch_ptr_);
      }
    }
    if ((local_198 & 0x200) != 0) {
      local_229 = 0;
      if (arena[3].impl_.first_arena_.cleanup_list_.head_ == (Chunk *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_228,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_lite.pb.cc"
                   ,0x110f,"from._impl_.optional_lazy_message_ != nullptr");
        local_229 = 1;
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_228);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_212,pLVar5);
      }
      if ((local_229 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_228);
      }
      if ((from->field_0)._impl_.optional_lazy_message_ == (TestAllTypesLite_NestedMessage *)0x0) {
        local_118 = arena[3].impl_.first_arena_.cleanup_list_.head_;
        local_110 = absl_log_internal_check_op_result;
        pTVar21 = (TestAllTypesLite_NestedMessage *)
                  google::protobuf::Arena::
                  CopyConstruct<proto2_unittest::TestAllTypesLite_NestedMessage>
                            ((Arena *)absl_log_internal_check_op_result,local_118);
        (from->field_0)._impl_.optional_lazy_message_ = pTVar21;
      }
      else {
        TestAllTypesLite_NestedMessage::MergeFrom
                  ((from->field_0)._impl_.optional_lazy_message_,
                   (TestAllTypesLite_NestedMessage *)arena[3].impl_.first_arena_.cleanup_list_.head_
                  );
      }
    }
    if ((local_198 & 0x400) != 0) {
      if (arena[3].impl_.first_arena_.cleanup_list_.next_ == (CleanupNode *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&oneof_from_case,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_lite.pb.cc"
                   ,0x1117,"from._impl_.optional_unverified_lazy_message_ != nullptr");
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                           ((LogMessage *)&oneof_from_case);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_22a,pLVar5);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&oneof_from_case);
      }
      if ((from->field_0)._impl_.optional_unverified_lazy_message_ ==
          (TestAllTypesLite_NestedMessage *)0x0) {
        local_128 = arena[3].impl_.first_arena_.cleanup_list_.next_;
        local_120 = absl_log_internal_check_op_result;
        pTVar21 = (TestAllTypesLite_NestedMessage *)
                  google::protobuf::Arena::
                  CopyConstruct<proto2_unittest::TestAllTypesLite_NestedMessage>
                            ((Arena *)absl_log_internal_check_op_result,local_128);
        (from->field_0)._impl_.optional_unverified_lazy_message_ = pTVar21;
      }
      else {
        TestAllTypesLite_NestedMessage::MergeFrom
                  ((from->field_0)._impl_.optional_unverified_lazy_message_,
                   (TestAllTypesLite_NestedMessage *)arena[3].impl_.first_arena_.cleanup_list_.next_
                  );
      }
    }
    if ((local_198 & 0x800) != 0) {
      (from->field_0)._impl_.optional_int64_ =
           (int64_t)arena[3].impl_.first_arena_.cleanup_list_.limit_;
    }
    if ((local_198 & 0x1000) != 0) {
      (from->field_0)._impl_.optional_int32_ =
           *(int32_t *)&arena[3].impl_.first_arena_.cleanup_list_.prefetch_ptr_;
    }
    if ((local_198 & 0x2000) != 0) {
      (from->field_0)._impl_.optional_uint32_ =
           *(uint32_t *)((long)&arena[3].impl_.first_arena_.cleanup_list_.prefetch_ptr_ + 4);
    }
    if ((local_198 & 0x4000) != 0) {
      *(__pointer_type *)((long)&from->field_0 + 0x250) =
           arena[3].impl_.first_arena_.string_block_._M_b._M_p;
    }
    if ((local_198 & 0x8000) != 0) {
      *(__int_type_conflict3 *)((long)&from->field_0 + 600) =
           arena[3].impl_.first_arena_.string_block_unused_.super___atomic_base<unsigned_long>._M_i;
    }
  }
  pTVar4 = from;
  if ((local_198 & 0xff0000) != 0) {
    if ((local_198 & 0x10000) != 0) {
      (from->field_0)._impl_.optional_sint32_ =
           *(int32_t *)&arena[3].impl_.first_arena_.head_._M_b._M_p;
    }
    if ((local_198 & 0x20000) != 0) {
      (from->field_0)._impl_.optional_fixed32_ =
           *(uint32_t *)((long)&arena[3].impl_.first_arena_.head_._M_b._M_p + 4);
    }
    if ((local_198 & 0x40000) != 0) {
      *(__int_type_conflict3 *)((long)&from->field_0 + 0x268) =
           arena[3].impl_.first_arena_.space_used_.super___atomic_base<unsigned_long>._M_i;
    }
    if ((local_198 & 0x80000) != 0) {
      *(__int_type_conflict3 *)((long)&from->field_0 + 0x270) =
           arena[3].impl_.first_arena_.space_allocated_.super___atomic_base<unsigned_long>._M_i;
    }
    if ((local_198 & 0x100000) != 0) {
      (from->field_0)._impl_.optional_sfixed32_ = *(int32_t *)&arena[3].impl_.first_arena_.parent_;
    }
    if ((local_198 & 0x200000) != 0) {
      (from->field_0)._impl_.optional_float_ =
           *(float *)((long)&arena[3].impl_.first_arena_.parent_ + 4);
    }
    if ((local_198 & 0x400000) != 0) {
      (from->field_0)._impl_.optional_double_ =
           *(double *)&arena[3].impl_.first_arena_.cached_block_length_;
    }
    if ((local_198 & 0x800000) != 0) {
      (from->field_0)._impl_.optional_bool_ =
           (bool)(*(byte *)&arena[3].impl_.first_arena_.cached_blocks_ & 1);
    }
  }
  if ((local_198 & 0xff000000) != 0) {
    if ((local_198 & 0x1000000) != 0) {
      (from->field_0)._impl_.optional_import_enum_ =
           *(int *)((long)&arena[3].impl_.first_arena_.cached_blocks_ + 4);
    }
    if ((local_198 & 0x2000000) != 0) {
      (from->field_0)._impl_.optional_nested_enum_ = (int)arena[4].impl_.tag_and_id_;
    }
    if ((local_198 & 0x4000000) != 0) {
      (from->field_0)._impl_.optional_foreign_enum_ =
           *(int *)((long)&arena[4].impl_.tag_and_id_ + 4);
    }
    if ((local_198 & 0x8000000) != 0) {
      local_68 = _internal_default_string_abi_cxx11_((TestAllTypesLite *)arena);
      local_60 = pTVar4;
      local_58 = &pTVar4->field_0;
      puVar18 = google::protobuf::internal::HasBits<2>::operator[]
                          (&(pTVar4->field_0)._impl_._has_bits_,0);
      psVar25 = local_68;
      *puVar18 = *puVar18 | 0x8000000;
      pAVar19 = google::protobuf::MessageLite::GetArena(&pTVar4->super_MessageLite);
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(pTVar4->field_0)._impl_.default_string_,psVar25,pAVar19);
    }
    pTVar4 = from;
    if ((local_198 & 0x10000000) != 0) {
      local_50 = _internal_default_bytes_abi_cxx11_((TestAllTypesLite *)arena);
      local_48 = pTVar4;
      local_40 = &pTVar4->field_0;
      puVar18 = google::protobuf::internal::HasBits<2>::operator[]
                          (&(pTVar4->field_0)._impl_._has_bits_,0);
      psVar25 = local_50;
      *puVar18 = *puVar18 | 0x10000000;
      pAVar19 = google::protobuf::MessageLite::GetArena(&pTVar4->super_MessageLite);
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(pTVar4->field_0)._impl_.default_bytes_,psVar25,pAVar19);
    }
    pTVar4 = from;
    if ((local_198 & 0x20000000) != 0) {
      local_38 = _internal_default_string_piece_abi_cxx11_((TestAllTypesLite *)arena);
      local_30 = pTVar4;
      local_28 = &pTVar4->field_0;
      puVar18 = google::protobuf::internal::HasBits<2>::operator[]
                          (&(pTVar4->field_0)._impl_._has_bits_,0);
      psVar25 = local_38;
      *puVar18 = *puVar18 | 0x20000000;
      pAVar19 = google::protobuf::MessageLite::GetArena(&pTVar4->super_MessageLite);
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(pTVar4->field_0)._impl_.default_string_piece_,psVar25,pAVar19);
    }
    pTVar4 = from;
    if ((local_198 & 0x40000000) != 0) {
      local_20 = _internal_default_cord_abi_cxx11_((TestAllTypesLite *)arena);
      local_18 = pTVar4;
      local_10 = &pTVar4->field_0;
      puVar18 = google::protobuf::internal::HasBits<2>::operator[]
                          (&(pTVar4->field_0)._impl_._has_bits_,0);
      psVar25 = local_20;
      *puVar18 = *puVar18 | 0x40000000;
      pAVar19 = google::protobuf::MessageLite::GetArena(&pTVar4->super_MessageLite);
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(pTVar4->field_0)._impl_.default_cord_,psVar25,pAVar19);
    }
    pTVar4 = from;
    if ((local_198 & 0x80000000) != 0) {
      value = _internal_optional_bytes_cord((TestAllTypesLite *)arena);
      _internal_set_optional_bytes_cord(pTVar4,value);
    }
  }
  puVar18 = google::protobuf::internal::HasBits<2>::operator[]
                      ((HasBits<2> *)&(arena->impl_).field_0x10,1);
  local_198 = *puVar18;
  if ((local_198 & 0xff) != 0) {
    if ((local_198 & 1) != 0) {
      (from->field_0)._impl_.deceptively_named_list_ =
           *(int32_t *)&arena[4].impl_.first_arena_.limit_;
    }
    if ((local_198 & 2) != 0) {
      (from->field_0)._impl_.default_int64_ = (int64_t)arena[4].impl_.first_arena_.prefetch_ptr_;
    }
    if ((local_198 & 4) != 0) {
      (from->field_0)._impl_.default_int32_ =
           *(int32_t *)&arena[4].impl_.first_arena_.cleanup_list_.head_;
    }
    if ((local_198 & 8) != 0) {
      (from->field_0)._impl_.default_uint32_ =
           *(uint32_t *)((long)&arena[4].impl_.first_arena_.cleanup_list_.head_ + 4);
    }
    if ((local_198 & 0x10) != 0) {
      (from->field_0)._impl_.default_uint64_ =
           (uint64_t)arena[4].impl_.first_arena_.cleanup_list_.next_;
    }
    if ((local_198 & 0x20) != 0) {
      (from->field_0)._impl_.default_sint64_ =
           (int64_t)arena[4].impl_.first_arena_.cleanup_list_.limit_;
    }
    if ((local_198 & 0x40) != 0) {
      (from->field_0)._impl_.default_sint32_ =
           *(int32_t *)&arena[4].impl_.first_arena_.cleanup_list_.prefetch_ptr_;
    }
    if ((local_198 & 0x80) != 0) {
      (from->field_0)._impl_.default_fixed32_ =
           *(uint32_t *)((long)&arena[4].impl_.first_arena_.cleanup_list_.prefetch_ptr_ + 4);
    }
  }
  if ((local_198 & 0xff00) != 0) {
    if ((local_198 & 0x100) != 0) {
      *(__pointer_type *)((long)&from->field_0 + 0x2f8) =
           arena[4].impl_.first_arena_.string_block_._M_b._M_p;
    }
    if ((local_198 & 0x200) != 0) {
      *(__int_type_conflict3 *)((long)&from->field_0 + 0x300) =
           arena[4].impl_.first_arena_.string_block_unused_.super___atomic_base<unsigned_long>._M_i;
    }
    if ((local_198 & 0x400) != 0) {
      (from->field_0)._impl_.default_sfixed32_ =
           *(int32_t *)&arena[4].impl_.first_arena_.head_._M_b._M_p;
    }
    if ((local_198 & 0x800) != 0) {
      (from->field_0)._impl_.default_float_ =
           *(float *)((long)&arena[4].impl_.first_arena_.head_._M_b._M_p + 4);
    }
    if ((local_198 & 0x1000) != 0) {
      *(__int_type_conflict3 *)((long)&from->field_0 + 0x310) =
           arena[4].impl_.first_arena_.space_used_.super___atomic_base<unsigned_long>._M_i;
    }
    if ((local_198 & 0x2000) != 0) {
      (from->field_0)._impl_.default_bool_ =
           (bool)((byte)arena[4].impl_.first_arena_.space_allocated_.
                        super___atomic_base<unsigned_long>._M_i & 1);
    }
    if ((local_198 & 0x4000) != 0) {
      (from->field_0)._impl_.default_nested_enum_ =
           *(int *)((long)&arena[4].impl_.first_arena_.space_allocated_.
                           super___atomic_base<unsigned_long>._M_i + 4);
    }
    if ((local_198 & 0x8000) != 0) {
      (from->field_0)._impl_.default_foreign_enum_ = *(int *)&arena[4].impl_.first_arena_.parent_;
    }
  }
  if ((local_198 & 0x10000) != 0) {
    (from->field_0)._impl_.default_import_enum_ =
         *(int *)((long)&arena[4].impl_.first_arena_.parent_ + 4);
  }
  google::protobuf::internal::HasBits<2>::Or
            (&(from->field_0)._impl_._has_bits_,(HasBits<2> *)&(arena->impl_).field_0x10);
  uVar1 = *(uint32_t *)&arena[4].impl_.first_arena_.cached_blocks_;
  if (uVar1 != 0) {
    uVar2 = (from->field_0)._impl_._oneof_case_[0];
    bVar27 = uVar2 != uVar1;
    if (bVar27) {
      if (uVar2 != 0) {
        clear_oneof_field(from);
      }
      (from->field_0)._impl_._oneof_case_[0] = uVar1;
    }
    if (uVar1 != 0) {
      if (uVar1 == 0x6f) {
        *(undefined4 *)((long)&from->field_0 + 0x328) =
             *(undefined4 *)&arena[4].impl_.first_arena_.cached_block_length_;
      }
      else if (uVar1 == 0x70) {
        if (bVar27) {
          pMVar26 = google::protobuf::MessageLite::CopyConstruct
                              ((Arena *)absl_log_internal_check_op_result,
                               *(MessageLite **)&arena[4].impl_.first_arena_.cached_block_length_);
          (from->field_0)._impl_.oneof_field_.oneof_nested_message_ = pMVar26;
        }
        else {
          google::protobuf::MessageLite::CheckTypeAndMergeFrom
                    ((from->field_0)._impl_.oneof_field_.oneof_nested_message_,
                     *(MessageLite **)&arena[4].impl_.first_arena_.cached_block_length_);
        }
      }
      else if (uVar1 == 0x71) {
        if (bVar27) {
          google::protobuf::internal::ArenaStringPtr::InitDefault
                    (&(from->field_0)._impl_.oneof_field_.oneof_string_);
        }
        paVar3 = &from->field_0;
        psVar25 = _internal_oneof_string_abi_cxx11_((TestAllTypesLite *)arena);
        google::protobuf::internal::ArenaStringPtr::Set<>
                  (&(paVar3->_impl_).oneof_field_.oneof_string_,psVar25,
                   (Arena *)absl_log_internal_check_op_result);
      }
      else if (uVar1 == 0x72) {
        if (bVar27) {
          google::protobuf::internal::ArenaStringPtr::InitDefault
                    (&(from->field_0)._impl_.oneof_field_.oneof_string_);
        }
        paVar3 = &from->field_0;
        psVar25 = _internal_oneof_bytes_abi_cxx11_((TestAllTypesLite *)arena);
        google::protobuf::internal::ArenaStringPtr::Set<>
                  (&(paVar3->_impl_).oneof_field_.oneof_string_,psVar25,
                   (Arena *)absl_log_internal_check_op_result);
      }
      else if (uVar1 == 0x73) {
        if (bVar27) {
          pMVar26 = google::protobuf::MessageLite::CopyConstruct
                              ((Arena *)absl_log_internal_check_op_result,
                               *(MessageLite **)&arena[4].impl_.first_arena_.cached_block_length_);
          (from->field_0)._impl_.oneof_field_.oneof_nested_message_ = pMVar26;
        }
        else {
          google::protobuf::MessageLite::CheckTypeAndMergeFrom
                    ((from->field_0)._impl_.oneof_field_.oneof_nested_message_,
                     *(MessageLite **)&arena[4].impl_.first_arena_.cached_block_length_);
        }
      }
      else if (uVar1 == 0x75) {
        if (bVar27) {
          pMVar26 = google::protobuf::MessageLite::CopyConstruct
                              ((Arena *)absl_log_internal_check_op_result,
                               *(MessageLite **)&arena[4].impl_.first_arena_.cached_block_length_);
          (from->field_0)._impl_.oneof_field_.oneof_nested_message_ = pMVar26;
        }
        else {
          google::protobuf::MessageLite::CheckTypeAndMergeFrom
                    ((from->field_0)._impl_.oneof_field_.oneof_nested_message_,
                     *(MessageLite **)&arena[4].impl_.first_arena_.cached_block_length_);
        }
      }
    }
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(from->super_MessageLite)._internal_metadata_,
             (InternalMetadata *)&(arena->impl_).alloc_policy_);
  return;
}

Assistant:

void TestAllTypesLite::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestAllTypesLite*>(&to_msg);
  auto& from = static_cast<const TestAllTypesLite&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestAllTypesLite)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeated_int32()->MergeFrom(from._internal_repeated_int32());
  _this->_internal_mutable_repeated_int64()->MergeFrom(from._internal_repeated_int64());
  _this->_internal_mutable_repeated_uint32()->MergeFrom(from._internal_repeated_uint32());
  _this->_internal_mutable_repeated_uint64()->MergeFrom(from._internal_repeated_uint64());
  _this->_internal_mutable_repeated_sint32()->MergeFrom(from._internal_repeated_sint32());
  _this->_internal_mutable_repeated_sint64()->MergeFrom(from._internal_repeated_sint64());
  _this->_internal_mutable_repeated_fixed32()->MergeFrom(from._internal_repeated_fixed32());
  _this->_internal_mutable_repeated_fixed64()->MergeFrom(from._internal_repeated_fixed64());
  _this->_internal_mutable_repeated_sfixed32()->MergeFrom(from._internal_repeated_sfixed32());
  _this->_internal_mutable_repeated_sfixed64()->MergeFrom(from._internal_repeated_sfixed64());
  _this->_internal_mutable_repeated_float()->MergeFrom(from._internal_repeated_float());
  _this->_internal_mutable_repeated_double()->MergeFrom(from._internal_repeated_double());
  _this->_internal_mutable_repeated_bool()->MergeFrom(from._internal_repeated_bool());
  _this->_internal_mutable_repeated_string()->MergeFrom(from._internal_repeated_string());
  _this->_internal_mutable_repeated_bytes()->MergeFrom(from._internal_repeated_bytes());
  _this->_internal_mutable_repeatedgroup()->MergeFrom(
      from._internal_repeatedgroup());
  _this->_internal_mutable_repeated_nested_message()->MergeFrom(
      from._internal_repeated_nested_message());
  _this->_internal_mutable_repeated_foreign_message()->MergeFrom(
      from._internal_repeated_foreign_message());
  _this->_internal_mutable_repeated_import_message()->MergeFrom(
      from._internal_repeated_import_message());
  _this->_internal_mutable_repeated_nested_enum()->MergeFrom(from._internal_repeated_nested_enum());
  _this->_internal_mutable_repeated_foreign_enum()->MergeFrom(from._internal_repeated_foreign_enum());
  _this->_internal_mutable_repeated_import_enum()->MergeFrom(from._internal_repeated_import_enum());
  _this->_internal_mutable_repeated_string_piece()->MergeFrom(from._internal_repeated_string_piece());
  _this->_internal_mutable_repeated_cord()->MergeFrom(from._internal_repeated_cord());
  _this->_internal_mutable_repeated_lazy_message()->MergeFrom(
      from._internal_repeated_lazy_message());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_optional_string(from._internal_optional_string());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_optional_bytes(from._internal_optional_bytes());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_internal_set_optional_string_piece(from._internal_optional_string_piece());
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_internal_set_optional_cord(from._internal_optional_cord());
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      ABSL_DCHECK(from._impl_.optionalgroup_ != nullptr);
      if (_this->_impl_.optionalgroup_ == nullptr) {
        _this->_impl_.optionalgroup_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.optionalgroup_);
      } else {
        _this->_impl_.optionalgroup_->MergeFrom(*from._impl_.optionalgroup_);
      }
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      ABSL_DCHECK(from._impl_.optional_nested_message_ != nullptr);
      if (_this->_impl_.optional_nested_message_ == nullptr) {
        _this->_impl_.optional_nested_message_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.optional_nested_message_);
      } else {
        _this->_impl_.optional_nested_message_->MergeFrom(*from._impl_.optional_nested_message_);
      }
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      ABSL_DCHECK(from._impl_.optional_foreign_message_ != nullptr);
      if (_this->_impl_.optional_foreign_message_ == nullptr) {
        _this->_impl_.optional_foreign_message_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.optional_foreign_message_);
      } else {
        _this->_impl_.optional_foreign_message_->MergeFrom(*from._impl_.optional_foreign_message_);
      }
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      ABSL_DCHECK(from._impl_.optional_import_message_ != nullptr);
      if (_this->_impl_.optional_import_message_ == nullptr) {
        _this->_impl_.optional_import_message_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.optional_import_message_);
      } else {
        _this->_impl_.optional_import_message_->MergeFrom(*from._impl_.optional_import_message_);
      }
    }
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      ABSL_DCHECK(from._impl_.optional_public_import_message_ != nullptr);
      if (_this->_impl_.optional_public_import_message_ == nullptr) {
        _this->_impl_.optional_public_import_message_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.optional_public_import_message_);
      } else {
        _this->_impl_.optional_public_import_message_->MergeFrom(*from._impl_.optional_public_import_message_);
      }
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      ABSL_DCHECK(from._impl_.optional_lazy_message_ != nullptr);
      if (_this->_impl_.optional_lazy_message_ == nullptr) {
        _this->_impl_.optional_lazy_message_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.optional_lazy_message_);
      } else {
        _this->_impl_.optional_lazy_message_->MergeFrom(*from._impl_.optional_lazy_message_);
      }
    }
    if ((cached_has_bits & 0x00000400u) != 0) {
      ABSL_DCHECK(from._impl_.optional_unverified_lazy_message_ != nullptr);
      if (_this->_impl_.optional_unverified_lazy_message_ == nullptr) {
        _this->_impl_.optional_unverified_lazy_message_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.optional_unverified_lazy_message_);
      } else {
        _this->_impl_.optional_unverified_lazy_message_->MergeFrom(*from._impl_.optional_unverified_lazy_message_);
      }
    }
    if ((cached_has_bits & 0x00000800u) != 0) {
      _this->_impl_.optional_int64_ = from._impl_.optional_int64_;
    }
    if ((cached_has_bits & 0x00001000u) != 0) {
      _this->_impl_.optional_int32_ = from._impl_.optional_int32_;
    }
    if ((cached_has_bits & 0x00002000u) != 0) {
      _this->_impl_.optional_uint32_ = from._impl_.optional_uint32_;
    }
    if ((cached_has_bits & 0x00004000u) != 0) {
      _this->_impl_.optional_uint64_ = from._impl_.optional_uint64_;
    }
    if ((cached_has_bits & 0x00008000u) != 0) {
      _this->_impl_.optional_sint64_ = from._impl_.optional_sint64_;
    }
  }
  if ((cached_has_bits & 0x00ff0000u) != 0) {
    if ((cached_has_bits & 0x00010000u) != 0) {
      _this->_impl_.optional_sint32_ = from._impl_.optional_sint32_;
    }
    if ((cached_has_bits & 0x00020000u) != 0) {
      _this->_impl_.optional_fixed32_ = from._impl_.optional_fixed32_;
    }
    if ((cached_has_bits & 0x00040000u) != 0) {
      _this->_impl_.optional_fixed64_ = from._impl_.optional_fixed64_;
    }
    if ((cached_has_bits & 0x00080000u) != 0) {
      _this->_impl_.optional_sfixed64_ = from._impl_.optional_sfixed64_;
    }
    if ((cached_has_bits & 0x00100000u) != 0) {
      _this->_impl_.optional_sfixed32_ = from._impl_.optional_sfixed32_;
    }
    if ((cached_has_bits & 0x00200000u) != 0) {
      _this->_impl_.optional_float_ = from._impl_.optional_float_;
    }
    if ((cached_has_bits & 0x00400000u) != 0) {
      _this->_impl_.optional_double_ = from._impl_.optional_double_;
    }
    if ((cached_has_bits & 0x00800000u) != 0) {
      _this->_impl_.optional_bool_ = from._impl_.optional_bool_;
    }
  }
  if ((cached_has_bits & 0xff000000u) != 0) {
    if ((cached_has_bits & 0x01000000u) != 0) {
      _this->_impl_.optional_import_enum_ = from._impl_.optional_import_enum_;
    }
    if ((cached_has_bits & 0x02000000u) != 0) {
      _this->_impl_.optional_nested_enum_ = from._impl_.optional_nested_enum_;
    }
    if ((cached_has_bits & 0x04000000u) != 0) {
      _this->_impl_.optional_foreign_enum_ = from._impl_.optional_foreign_enum_;
    }
    if ((cached_has_bits & 0x08000000u) != 0) {
      _this->_internal_set_default_string(from._internal_default_string());
    }
    if ((cached_has_bits & 0x10000000u) != 0) {
      _this->_internal_set_default_bytes(from._internal_default_bytes());
    }
    if ((cached_has_bits & 0x20000000u) != 0) {
      _this->_internal_set_default_string_piece(from._internal_default_string_piece());
    }
    if ((cached_has_bits & 0x40000000u) != 0) {
      _this->_internal_set_default_cord(from._internal_default_cord());
    }
    if ((cached_has_bits & 0x80000000u) != 0) {
      _this->_internal_set_optional_bytes_cord(from._internal_optional_bytes_cord());
    }
  }
  cached_has_bits = from._impl_._has_bits_[1];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_impl_.deceptively_named_list_ = from._impl_.deceptively_named_list_;
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.default_int64_ = from._impl_.default_int64_;
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.default_int32_ = from._impl_.default_int32_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.default_uint32_ = from._impl_.default_uint32_;
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_impl_.default_uint64_ = from._impl_.default_uint64_;
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_impl_.default_sint64_ = from._impl_.default_sint64_;
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      _this->_impl_.default_sint32_ = from._impl_.default_sint32_;
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      _this->_impl_.default_fixed32_ = from._impl_.default_fixed32_;
    }
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      _this->_impl_.default_fixed64_ = from._impl_.default_fixed64_;
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      _this->_impl_.default_sfixed64_ = from._impl_.default_sfixed64_;
    }
    if ((cached_has_bits & 0x00000400u) != 0) {
      _this->_impl_.default_sfixed32_ = from._impl_.default_sfixed32_;
    }
    if ((cached_has_bits & 0x00000800u) != 0) {
      _this->_impl_.default_float_ = from._impl_.default_float_;
    }
    if ((cached_has_bits & 0x00001000u) != 0) {
      _this->_impl_.default_double_ = from._impl_.default_double_;
    }
    if ((cached_has_bits & 0x00002000u) != 0) {
      _this->_impl_.default_bool_ = from._impl_.default_bool_;
    }
    if ((cached_has_bits & 0x00004000u) != 0) {
      _this->_impl_.default_nested_enum_ = from._impl_.default_nested_enum_;
    }
    if ((cached_has_bits & 0x00008000u) != 0) {
      _this->_impl_.default_foreign_enum_ = from._impl_.default_foreign_enum_;
    }
  }
  if ((cached_has_bits & 0x00010000u) != 0) {
    _this->_impl_.default_import_enum_ = from._impl_.default_import_enum_;
  }
  _this->_impl_._has_bits_.Or(from._impl_._has_bits_);
  if (const uint32_t oneof_from_case = from._impl_._oneof_case_[0]) {
    const uint32_t oneof_to_case = _this->_impl_._oneof_case_[0];
    const bool oneof_needs_init = oneof_to_case != oneof_from_case;
    if (oneof_needs_init) {
      if (oneof_to_case != 0) {
        _this->clear_oneof_field();
      }
      _this->_impl_._oneof_case_[0] = oneof_from_case;
    }

    switch (oneof_from_case) {
      case kOneofUint32: {
        _this->_impl_.oneof_field_.oneof_uint32_ = from._impl_.oneof_field_.oneof_uint32_;
        break;
      }
      case kOneofNestedMessage: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_nested_message_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.oneof_field_.oneof_nested_message_);
        } else {
          _this->_impl_.oneof_field_.oneof_nested_message_->CheckTypeAndMergeFrom(*from._impl_.oneof_field_.oneof_nested_message_);
        }
        break;
      }
      case kOneofString: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_string_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_string_.Set(from._internal_oneof_string(), arena);
        break;
      }
      case kOneofBytes: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_bytes_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_bytes_.Set(from._internal_oneof_bytes(), arena);
        break;
      }
      case kOneofLazyNestedMessage: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_lazy_nested_message_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.oneof_field_.oneof_lazy_nested_message_);
        } else {
          _this->_impl_.oneof_field_.oneof_lazy_nested_message_->CheckTypeAndMergeFrom(*from._impl_.oneof_field_.oneof_lazy_nested_message_);
        }
        break;
      }
      case kOneofNestedMessage2: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_nested_message2_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.oneof_field_.oneof_nested_message2_);
        } else {
          _this->_impl_.oneof_field_.oneof_nested_message2_->CheckTypeAndMergeFrom(*from._impl_.oneof_field_.oneof_nested_message2_);
        }
        break;
      }
      case ONEOF_FIELD_NOT_SET:
        break;
    }
  }
  _this->_internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}